

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::copyEncryptionParameters(QPDFWriter *this,QPDF *qpdf)

{
  int V_00;
  bool bVar1;
  int iVar2;
  int R;
  element_type *peVar3;
  longlong lVar4;
  string *user_password;
  bool local_52a;
  allocator<char> local_4c9;
  string local_4c8 [32];
  QPDFObjectHandle local_4a8;
  string local_498;
  allocator<char> local_471;
  string local_470 [32];
  QPDFObjectHandle local_450;
  string local_440;
  allocator<char> local_419;
  string local_418 [32];
  QPDFObjectHandle local_3f8;
  allocator<char> local_3e1;
  string local_3e0 [32];
  QPDFObjectHandle local_3c0;
  string local_3b0;
  allocator<char> local_389;
  string local_388 [32];
  QPDFObjectHandle local_368;
  string local_358;
  allocator<char> local_331;
  string local_330 [32];
  QPDFObjectHandle local_310;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8 [32];
  QPDFObjectHandle local_2b8;
  string local_2a8;
  undefined1 local_288 [8];
  string encryption_key;
  string Perms;
  string UE;
  string OE;
  string local_200 [32];
  QPDFObjectHandle local_1e0;
  byte local_1cc;
  byte local_1cb;
  byte local_1ca;
  allocator<char> local_1c9;
  string local_1c8 [32];
  QPDFObjectHandle local_1a8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168 [32];
  QPDFObjectHandle local_148;
  int local_138;
  allocator<char> local_131;
  int key_len;
  QPDFObjectHandle local_110;
  int local_100;
  allocator<char> local_f9;
  int V;
  undefined1 local_d8 [8];
  QPDFObjectHandle encrypt;
  string local_c0 [32];
  QPDFObjectHandle local_a0;
  QPDFObjectHandle local_90;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  QPDFObjectHandle trailer;
  QPDF *qpdf_local;
  QPDFWriter *this_local;
  
  trailer.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)qpdf;
  peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar3->preserve_encryption = false;
  QPDF::getTrailer((QPDF *)local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"/Encrypt",&local_49);
  bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    generateID(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"/ID",
               (allocator<char> *)
               ((long)&encrypt.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey(&local_a0,(string *)local_28);
    QPDFObjectHandle::getArrayItem(&local_90,(int)&local_a0);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_80,&local_90);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=((string *)&peVar3->id1,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    QPDFObjectHandle::~QPDFObjectHandle(&local_90);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&encrypt.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&V,"/Encrypt",&local_f9);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d8,(string *)local_28);
    std::__cxx11::string::~string((string *)&V);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&key_len,"/V",&local_131);
    QPDFObjectHandle::getKey(&local_110,(string *)local_d8);
    iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_110);
    QPDFObjectHandle::~QPDFObjectHandle(&local_110);
    std::__cxx11::string::~string((string *)&key_len);
    std::allocator<char>::~allocator(&local_131);
    local_138 = 5;
    local_100 = iVar2;
    if (1 < iVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_168,"/Length",&local_169);
      QPDFObjectHandle::getKey(&local_148,(string *)local_d8);
      local_138 = QPDFObjectHandle::getIntValueAsInt(&local_148);
      local_138 = local_138 / 8;
      QPDFObjectHandle::~QPDFObjectHandle(&local_148);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    std::allocator<char>::allocator();
    local_1ca = 0;
    local_1cb = 0;
    local_1cc = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"/EncryptMetadata",&local_191);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_d8,&local_190);
    local_52a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_1ca = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"/EncryptMetadata",&local_1c9);
      local_1cb = 1;
      QPDFObjectHandle::getKey(&local_1a8,(string *)local_d8);
      local_1cc = 1;
      local_52a = QPDFObjectHandle::isBool(&local_1a8);
    }
    if ((local_1cc & 1) != 0) {
      QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
    }
    if ((local_1cb & 1) != 0) {
      std::__cxx11::string::~string(local_1c8);
    }
    if ((local_1ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c9);
    }
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    if (local_52a != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"/EncryptMetadata",(allocator<char> *)(OE.field_2._M_local_buf + 0xf));
      QPDFObjectHandle::getKey(&local_1e0,(string *)local_d8);
      bVar1 = QPDFObjectHandle::getBoolValue(&local_1e0);
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar3->encrypt_metadata = bVar1;
      QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)(OE.field_2._M_local_buf + 0xf));
    }
    if (3 < local_100) {
      peVar3 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar3->encrypt_use_aes = true;
    }
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QTC::TC("qpdf","QPDFWriter copy encrypt metadata",(byte)~peVar3->encrypt_metadata & 1);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QTC::TC("qpdf","QPDFWriter copy use_aes",(byte)~peVar3->encrypt_use_aes & 1);
    std::__cxx11::string::string((string *)(UE.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(Perms.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(encryption_key.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_288);
    if (4 < local_100) {
      QTC::TC("qpdf","QPDFWriter copy V5",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d8,"/OE",&local_2d9);
      QPDFObjectHandle::getKey(&local_2b8,(string *)local_d8);
      QPDFObjectHandle::getStringValue_abi_cxx11_(&local_2a8,&local_2b8);
      std::__cxx11::string::operator=((string *)(UE.field_2._M_local_buf + 8),(string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      QPDFObjectHandle::~QPDFObjectHandle(&local_2b8);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_330,"/UE",&local_331);
      QPDFObjectHandle::getKey(&local_310,(string *)local_d8);
      QPDFObjectHandle::getStringValue_abi_cxx11_(&local_300,&local_310);
      std::__cxx11::string::operator=
                ((string *)(Perms.field_2._M_local_buf + 8),(string *)&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      QPDFObjectHandle::~QPDFObjectHandle(&local_310);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator(&local_331);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_388,"/Perms",&local_389);
      QPDFObjectHandle::getKey(&local_368,(string *)local_d8);
      QPDFObjectHandle::getStringValue_abi_cxx11_(&local_358,&local_368);
      std::__cxx11::string::operator=
                ((string *)(encryption_key.field_2._M_local_buf + 8),(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      QPDFObjectHandle::~QPDFObjectHandle(&local_368);
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator(&local_389);
      QPDF::getEncryptionKey_abi_cxx11_
                (&local_3b0,
                 (QPDF *)trailer.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
      std::__cxx11::string::operator=((string *)local_288,(string *)&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
    }
    V_00 = local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3e0,"/R",&local_3e1);
    QPDFObjectHandle::getKey(&local_3c0,(string *)local_d8);
    R = QPDFObjectHandle::getIntValueAsInt(&local_3c0);
    iVar2 = local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_418,"/P",&local_419);
    QPDFObjectHandle::getKey(&local_3f8,(string *)local_d8);
    lVar4 = QPDFObjectHandle::getIntValue(&local_3f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_470,"/O",&local_471);
    QPDFObjectHandle::getKey(&local_450,(string *)local_d8);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_440,&local_450);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4c8,"/U",&local_4c9);
    QPDFObjectHandle::getKey(&local_4a8,(string *)local_d8);
    QPDFObjectHandle::getStringValue_abi_cxx11_(&local_498,&local_4a8);
    peVar3 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    user_password =
         QPDF::getPaddedUserPassword_abi_cxx11_
                   ((QPDF *)trailer.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
    setEncryptionParametersInternal
              (this,V_00,R,iVar2,(int)lVar4,&local_440,&local_498,(string *)((long)&UE.field_2 + 8),
               (string *)((long)&Perms.field_2 + 8),(string *)((long)&encryption_key.field_2 + 8),
               &peVar3->id1,user_password,(string *)local_288);
    std::__cxx11::string::~string((string *)&local_498);
    QPDFObjectHandle::~QPDFObjectHandle(&local_4a8);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    std::__cxx11::string::~string((string *)&local_440);
    QPDFObjectHandle::~QPDFObjectHandle(&local_450);
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator(&local_471);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3f8);
    std::__cxx11::string::~string(local_418);
    std::allocator<char>::~allocator(&local_419);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3c0);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)(encryption_key.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(Perms.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(UE.field_2._M_local_buf + 8));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d8);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
  return;
}

Assistant:

void
QPDFWriter::copyEncryptionParameters(QPDF& qpdf)
{
    m->preserve_encryption = false;
    QPDFObjectHandle trailer = qpdf.getTrailer();
    if (trailer.hasKey("/Encrypt")) {
        generateID();
        m->id1 = trailer.getKey("/ID").getArrayItem(0).getStringValue();
        QPDFObjectHandle encrypt = trailer.getKey("/Encrypt");
        int V = encrypt.getKey("/V").getIntValueAsInt();
        int key_len = 5;
        if (V > 1) {
            key_len = encrypt.getKey("/Length").getIntValueAsInt() / 8;
        }
        if (encrypt.hasKey("/EncryptMetadata") && encrypt.getKey("/EncryptMetadata").isBool()) {
            m->encrypt_metadata = encrypt.getKey("/EncryptMetadata").getBoolValue();
        }
        if (V >= 4) {
            // When copying encryption parameters, use AES even if the original file did not.
            // Acrobat doesn't create files with V >= 4 that don't use AES, and the logic of
            // figuring out whether AES is used or not is complicated with /StmF, /StrF, and /EFF
            // all potentially having different values.
            m->encrypt_use_aes = true;
        }
        QTC::TC("qpdf", "QPDFWriter copy encrypt metadata", m->encrypt_metadata ? 0 : 1);
        QTC::TC("qpdf", "QPDFWriter copy use_aes", m->encrypt_use_aes ? 0 : 1);
        std::string OE;
        std::string UE;
        std::string Perms;
        std::string encryption_key;
        if (V >= 5) {
            QTC::TC("qpdf", "QPDFWriter copy V5");
            OE = encrypt.getKey("/OE").getStringValue();
            UE = encrypt.getKey("/UE").getStringValue();
            Perms = encrypt.getKey("/Perms").getStringValue();
            encryption_key = qpdf.getEncryptionKey();
        }

        setEncryptionParametersInternal(
            V,
            encrypt.getKey("/R").getIntValueAsInt(),
            key_len,
            static_cast<int>(encrypt.getKey("/P").getIntValue()),
            encrypt.getKey("/O").getStringValue(),
            encrypt.getKey("/U").getStringValue(),
            OE,
            UE,
            Perms,
            m->id1, // m->id1 == the other file's id1
            qpdf.getPaddedUserPassword(),
            encryption_key);
    }
}